

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

CURLcode libcurl_generate_mime_part(CURL *curl,GlobalConfig *config,tool_mime *part,int mimeno)

{
  CURLcode CVar1;
  uint local_54;
  char *pcStack_50;
  int slistno;
  char *filename;
  char *data;
  char *escaped;
  CURLcode local_30;
  int submimeno;
  CURLcode ret;
  int mimeno_local;
  tool_mime *part_local;
  GlobalConfig *config_local;
  CURL *curl_local;
  
  local_30 = 0;
  escaped._4_4_ = 0;
  data = (char *)0x0;
  filename = (char *)0x0;
  pcStack_50 = part->filename;
  submimeno = mimeno;
  _ret = part;
  part_local = (tool_mime *)config;
  config_local = (GlobalConfig *)curl;
  if ((part->prev != (tool_mime *)0x0) &&
     (CVar1 = libcurl_generate_mime_part(curl,config,part->prev,mimeno), CVar1 != CURLE_OK)) {
    return CVar1;
  }
  local_30 = 0;
  local_30 = easysrc_addf(&easysrc_code,"part%d = curl_mime_addpart(mime%d);",(ulong)(uint)submimeno
                          ,(ulong)(uint)submimeno);
  if (local_30 != CURLE_OK) goto LAB_0012443f;
  switch(_ret->kind) {
  case TOOLMIME_PARTS:
    local_30 = libcurl_generate_mime
                         ((CURL *)config_local,(GlobalConfig *)part_local,_ret,
                          (int *)((long)&escaped + 4));
    if (local_30 == CURLE_OK) {
      local_30 = easysrc_addf(&easysrc_code,"curl_mime_subparts(part%d, mime%d);",
                              (ulong)(uint)submimeno,(ulong)escaped._4_4_);
      if (local_30 != CURLE_OK) goto LAB_0012443f;
      local_30 = easysrc_addf(&easysrc_code,"mime%d = NULL;",(ulong)escaped._4_4_);
      goto joined_r0x0012414d;
    }
    break;
  case TOOLMIME_DATA:
    filename = _ret->data;
    free(data);
    data = (char *)0x0;
    data = c_escape(filename,-1);
    if (data == (char *)0x0) {
      local_30 = CURLE_OUT_OF_MEMORY;
      goto LAB_0012443f;
    }
    local_30 = easysrc_addf(&easysrc_code,"curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                            (ulong)(uint)submimeno,data);
    goto joined_r0x0012414d;
  case TOOLMIME_FILE:
  case TOOLMIME_FILEDATA:
    data = c_escape(_ret->data,-1);
    if (data == (char *)0x0) {
      local_30 = CURLE_OUT_OF_MEMORY;
      goto LAB_0012443f;
    }
    local_30 = easysrc_addf(&easysrc_code,"curl_mime_filedata(part%d, \"%s\");",
                            (ulong)(uint)submimeno,data);
    if (local_30 != CURLE_OK) goto LAB_0012443f;
    if ((_ret->kind == TOOLMIME_FILEDATA) && (pcStack_50 == (char *)0x0)) {
      local_30 = easysrc_addf(&easysrc_code,"curl_mime_filename(part%d, NULL);",
                              (ulong)(uint)submimeno);
      goto joined_r0x0012414d;
    }
    break;
  case TOOLMIME_STDIN:
    if (pcStack_50 == (char *)0x0) {
      pcStack_50 = "-";
    }
  case TOOLMIME_STDINDATA:
    local_30 = easysrc_addf(&easysrc_code,
                            "curl_mime_data_cb(part%d, -1, (curl_read_callback) fread, \\",
                            (ulong)(uint)submimeno);
    if (local_30 != CURLE_OK) goto LAB_0012443f;
    local_30 = easysrc_add(&easysrc_code,
                           "                  (curl_seek_callback) fseek, NULL, stdin);");
joined_r0x0012414d:
    if (local_30 != CURLE_OK) goto LAB_0012443f;
  }
  if ((local_30 == CURLE_OK) && (_ret->encoder != (char *)0x0)) {
    free(data);
    data = (char *)0x0;
    data = c_escape(_ret->encoder,-1);
    if (data == (char *)0x0) {
      local_30 = CURLE_OUT_OF_MEMORY;
      goto LAB_0012443f;
    }
    local_30 = easysrc_addf(&easysrc_code,"curl_mime_encoder(part%d, \"%s\");",
                            (ulong)(uint)submimeno,data);
    if (local_30 != CURLE_OK) goto LAB_0012443f;
  }
  if ((local_30 == CURLE_OK) && (pcStack_50 != (char *)0x0)) {
    free(data);
    data = (char *)0x0;
    data = c_escape(pcStack_50,-1);
    if (data == (char *)0x0) {
      local_30 = CURLE_OUT_OF_MEMORY;
      goto LAB_0012443f;
    }
    local_30 = easysrc_addf(&easysrc_code,"curl_mime_filename(part%d, \"%s\");",
                            (ulong)(uint)submimeno,data);
    if (local_30 != CURLE_OK) goto LAB_0012443f;
  }
  if ((local_30 == CURLE_OK) && (_ret->name != (char *)0x0)) {
    free(data);
    data = (char *)0x0;
    data = c_escape(_ret->name,-1);
    if (data == (char *)0x0) {
      local_30 = CURLE_OUT_OF_MEMORY;
      goto LAB_0012443f;
    }
    local_30 = easysrc_addf(&easysrc_code,"curl_mime_name(part%d, \"%s\");",(ulong)(uint)submimeno,
                            data);
    if (local_30 != CURLE_OK) goto LAB_0012443f;
  }
  if ((local_30 == CURLE_OK) && (_ret->type != (char *)0x0)) {
    free(data);
    data = (char *)0x0;
    data = c_escape(_ret->type,-1);
    if (data == (char *)0x0) {
      local_30 = CURLE_OUT_OF_MEMORY;
      goto LAB_0012443f;
    }
    local_30 = easysrc_addf(&easysrc_code,"curl_mime_type(part%d, \"%s\");",(ulong)(uint)submimeno,
                            data);
    if (local_30 != CURLE_OK) goto LAB_0012443f;
  }
  if ((((local_30 == CURLE_OK) && (_ret->headers != (curl_slist *)0x0)) &&
      (local_30 = libcurl_generate_slist(_ret->headers,(int *)&local_54), local_30 == CURLE_OK)) &&
     (local_30 = easysrc_addf(&easysrc_code,"curl_mime_headers(part%d, slist%d, 1);",
                              (ulong)(uint)submimeno,(ulong)local_54), local_30 == CURLE_OK)) {
    local_30 = easysrc_addf(&easysrc_code,"slist%d = NULL;",(ulong)local_54);
  }
LAB_0012443f:
  free(data);
  return local_30;
}

Assistant:

static CURLcode libcurl_generate_mime_part(CURL *curl,
                                           struct GlobalConfig *config,
                                           struct tool_mime *part,
                                           int mimeno)
{
  CURLcode ret = CURLE_OK;
  int submimeno = 0;
  char *escaped = NULL;
  const char *data = NULL;
  const char *filename = part->filename;

  /* Parts are linked in reverse order. */
  if(part->prev) {
    ret = libcurl_generate_mime_part(curl, config, part->prev, mimeno);
    if(ret)
      return ret;
  }

  /* Create the part. */
  CODE2("part%d = curl_mime_addpart(mime%d);", mimeno, mimeno);

  switch(part->kind) {
  case TOOLMIME_PARTS:
    ret = libcurl_generate_mime(curl, config, part, &submimeno);
    if(!ret) {
      CODE2("curl_mime_subparts(part%d, mime%d);", mimeno, submimeno);
      CODE1("mime%d = NULL;", submimeno);   /* Avoid freeing in CLEAN. */
    }
    break;

  case TOOLMIME_DATA:
#ifdef CURL_DOES_CONVERSIONS
    /* Data will be set in ASCII, thus issue a comment with clear text. */
    escaped = c_escape(part->data, ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE1("/* \"%s\" */", escaped);

    /* Our data is always textual: convert it to ASCII. */
    {
      size_t size = strlen(part->data);
      char *cp = malloc(size + 1);

      NULL_CHECK(cp);
      memcpy(cp, part->data, size + 1);
      ret = convert_to_network(cp, size);
      data = cp;
    }
#else
    data = part->data;
#endif
    if(!ret) {
      Curl_safefree(escaped);
      escaped = c_escape(data, ZERO_TERMINATED);
      NULL_CHECK(escaped);
      CODE2("curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                            mimeno, escaped);
    }
    break;

  case TOOLMIME_FILE:
  case TOOLMIME_FILEDATA:
    escaped = c_escape(part->data, ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE2("curl_mime_filedata(part%d, \"%s\");", mimeno, escaped);
    if(part->kind == TOOLMIME_FILEDATA && !filename) {
      CODE1("curl_mime_filename(part%d, NULL);", mimeno);
    }
    break;

  case TOOLMIME_STDIN:
    if(!filename)
      filename = "-";
    /* FALLTHROUGH */
  case TOOLMIME_STDINDATA:
    /* Can only be reading stdin in the current context. */
    CODE1("curl_mime_data_cb(part%d, -1, (curl_read_callback) fread, \\",
          mimeno);
    CODE0("                  (curl_seek_callback) fseek, NULL, stdin);");
    break;
  default:
    /* Other cases not possible in this context. */
    break;
  }

  if(!ret && part->encoder) {
    Curl_safefree(escaped);
    escaped = c_escape(part->encoder, ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE2("curl_mime_encoder(part%d, \"%s\");", mimeno, escaped);
  }

  if(!ret && filename) {
    Curl_safefree(escaped);
    escaped = c_escape(filename, ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE2("curl_mime_filename(part%d, \"%s\");", mimeno, escaped);
  }

  if(!ret && part->name) {
    Curl_safefree(escaped);
    escaped = c_escape(part->name, ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE2("curl_mime_name(part%d, \"%s\");", mimeno, escaped);
  }

  if(!ret && part->type) {
    Curl_safefree(escaped);
    escaped = c_escape(part->type, ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE2("curl_mime_type(part%d, \"%s\");", mimeno, escaped);
  }

  if(!ret && part->headers) {
    int slistno;

    ret = libcurl_generate_slist(part->headers, &slistno);
    if(!ret) {
      CODE2("curl_mime_headers(part%d, slist%d, 1);", mimeno, slistno);
      CODE1("slist%d = NULL;", slistno); /* Prevent CLEANing. */
    }
  }

nomem:
#ifdef CURL_DOES_CONVERSIONS
  if(data)
    free((char *) data);
#endif

  Curl_safefree(escaped);
  return ret;
}